

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

ARTConflictType __thiscall
duckdb::ART::InsertIntoNode
          (ART *this,Node *node,ARTKey *key,idx_t depth,ARTKey *row_id,GateStatus status,
          optional_ptr<duckdb::ART,_true> delete_art,IndexAppendMode append_mode)

{
  uint8_t byte;
  ARTConflictType AVar1;
  unsafe_optional_ptr<Node> node_00;
  ulong uVar2;
  Node leaf;
  reference<Node> ref;
  
  node_00 = GetChildInternal<duckdb::Node_const>(this,node,key->data[depth]);
  if (node_00.ptr == (Node *)0x0) {
    if (status == GATE_SET) {
      leaf.super_IndexPointer.data = (IndexPointer)0;
      byte = key->data[depth];
      AVar1 = Insert(this,&leaf,key,depth + 1,row_id,GATE_SET,delete_art,append_mode);
      Node::InsertChild(this,node,byte,leaf);
    }
    else {
      ref._M_data = &leaf;
      leaf.super_IndexPointer.data = (IndexPointer)0;
      if (depth + 1 < key->len) {
        Prefix::New(this,&ref,key,depth + 1,key->len + ~depth);
      }
      uVar2 = *(ulong *)row_id->data & 0xfffffffffffffff8 ^ 0x87;
      ((ref._M_data)->super_IndexPointer).data =
           *(ulong *)row_id->data >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
           (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
           (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
           uVar2 << 0x38;
      Node::InsertChild(this,node,key->data[depth],leaf);
      AVar1 = NO_CONFLICT;
    }
  }
  else {
    AVar1 = Insert(this,node_00.ptr,key,depth + 1,row_id,status,delete_art,append_mode);
    Node::ReplaceChild(node,this,key->data[depth],(Node)((node_00.ptr)->super_IndexPointer).data);
  }
  return AVar1;
}

Assistant:

ARTConflictType ART::InsertIntoNode(Node &node, const ARTKey &key, const idx_t depth, const ARTKey &row_id,
                                    const GateStatus status, optional_ptr<ART> delete_art,
                                    const IndexAppendMode append_mode) {
	D_ASSERT(depth < key.len);
	auto child = node.GetChildMutable(*this, key[depth]);

	// Recurse, if a child exists at key[depth].
	if (child) {
		D_ASSERT(child->HasMetadata());
		auto conflict_type = Insert(*child, key, depth + 1, row_id, status, delete_art, append_mode);
		node.ReplaceChild(*this, key[depth], *child);
		return conflict_type;
	}

	// Create an inlined prefix at key[depth].
	if (status == GateStatus::GATE_SET) {
		Node remainder;
		auto byte = key[depth];
		auto conflict_type = Insert(remainder, key, depth + 1, row_id, status, delete_art, append_mode);
		Node::InsertChild(*this, node, byte, remainder);
		return conflict_type;
	}

	// Insert an inlined leaf at key[depth].
	Node leaf;
	reference<Node> ref(leaf);

	// Create the prefix.
	if (depth + 1 < key.len) {
		auto count = key.len - depth - 1;
		Prefix::New(*this, ref, key, depth + 1, count);
	}

	// Create the inlined leaf.
	Leaf::New(ref, row_id.GetRowId());
	Node::InsertChild(*this, node, key[depth], leaf);
	return ARTConflictType::NO_CONFLICT;
}